

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::AsyncStreamFd::abortRead(AsyncStreamFd *this)

{
  int iVar1;
  Fault f;
  Fault local_10;
  
  do {
    iVar1 = shutdown((this->super_OwnedFileDescriptor).fd,0);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  kj::_::Debug::Fault::Fault
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x1f0,iVar1,"shutdown(fd, SHUT_RD)","");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void abortRead() override {
    // There's no legitimate way to get an AsyncStreamFd that isn't a socket through the
    // UnixAsyncIoProvider interface.
    KJ_SYSCALL(shutdown(fd, SHUT_RD));
  }